

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

uint64_t writeBlockFingerprint(char *block,size_t psize)

{
  uchar Component;
  size_t Index;
  size_t i;
  size_t print;
  size_t Stride;
  size_t Start;
  size_t psize_local;
  char *block_local;
  uint64_t local_8;
  
  print = 0;
  if (block == (char *)0x0) {
    local_8 = 0;
  }
  else {
    for (i = 0; i < 8; i = i + 1) {
      Component = '\0';
      for (Index = (psize >> 4) + (psize >> 3) * i; block[Index] == '\0' && Index < psize - 1;
          Index = Index + 1) {
        Component = Component + '\x01';
      }
      print = (ulong)(byte)(Component + block[Index]) << ((byte)(i << 3) & 0x3f) | print;
    }
    local_8 = print;
  }
  return local_8;
}

Assistant:

static uint64_t writeBlockFingerprint(char *block, size_t psize)
{
    size_t Start = psize / 16;
    size_t Stride = psize / 8;
    size_t print = 0;
    if (!block)
        return 0;
    for (size_t i = 0; i < 8; i++)
    {
        size_t Index = Start + Stride * i;
        unsigned char Component = 0;
        while ((block[Index] == 0) && (Index < (psize - 1)))
        {
            Component++;
            Index++;
        }
        Component += (unsigned char)block[Index];
        print |= (((size_t)Component) << (8 * i));
    }
    return print;
}